

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Thing_SetSpecial(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                       int arg4)

{
  undefined1 local_40 [8];
  FActorIterator iterator;
  AActor *actor;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  if (arg0 == 0) {
    if (it != (AActor *)0x0) {
      it->special = arg1;
      it->args[0] = arg2;
      it->args[1] = arg3;
      it->args[2] = arg4;
    }
  }
  else {
    FActorIterator::FActorIterator((FActorIterator *)local_40,arg0);
    while (iterator._8_8_ = FActorIterator::Next((FActorIterator *)local_40),
          (AActor *)iterator._8_8_ != (AActor *)0x0) {
      ((AActor *)iterator._8_8_)->special = arg1;
      ((AActor *)iterator._8_8_)->args[0] = arg2;
      ((AActor *)iterator._8_8_)->args[1] = arg3;
      ((AActor *)iterator._8_8_)->args[2] = arg4;
    }
  }
  return 1;
}

Assistant:

FUNC(LS_Thing_SetSpecial)	// [BC]
// Thing_SetSpecial (tid, special, arg1, arg2, arg3)
// [RH] Use the SetThingSpecial ACS command instead.
// It can set all args and not just the first three.
{
	if (arg0 == 0)
	{
		if (it != NULL)
		{
			it->special = arg1;
			it->args[0] = arg2;
			it->args[1] = arg3;
			it->args[2] = arg4;
		}
	}
	else
	{
		AActor *actor;
		FActorIterator iterator (arg0);

		while ( (actor = iterator.Next ()) )
		{
			actor->special = arg1;
			actor->args[0] = arg2;
			actor->args[1] = arg3;
			actor->args[2] = arg4;
		}
	}
	return true;
}